

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_32x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  undefined7 in_register_00000009;
  long lVar4;
  int in_R9D;
  int i;
  ulong uVar5;
  __m128i *out;
  int in_stack_fffffffffffffba8;
  __m128i in [64];
  
  piVar3 = av1_fwd_txfm_shift_ls[0x10];
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar1 = *(code **)((long)row_highbd_txfm32x8_arr + uVar5);
  pcVar2 = *(code **)((long)col_highbd_txfm8x32_arr + uVar5);
  out = in;
  load_buffer_32x8n(input,out,stride,(int)*av1_fwd_txfm_shift_ls[0x10],8,in_R9D,
                    in_stack_fffffffffffffba8);
  for (uVar5 = 0; uVar5 < 8; uVar5 = uVar5 + 2) {
    (*pcVar1)(out,out,0xd,8);
    out = out + 2;
  }
  col_txfm_16x16_rounding(in,-(int)piVar3[1]);
  transpose_8nx8n(in,(__m128i *)coeff,0x20,8);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 0x10) {
    (*pcVar2)((long)coeff + lVar4,(long)coeff + lVar4,0xc,2);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X8];
  const int txw_idx = get_txw_idx(TX_32X8);
  const int txh_idx = get_txh_idx(TX_32X8);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm32x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  const int txfm_size_col = tx_size_wide[TX_32X8];
  const int txfm_size_row = tx_size_high[TX_32X8];
  const int num_col = txfm_size_row >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 8);
  for (int i = 0; i < txfm_size_row; i += 2) {
    col_txfm((in + i), (in + i), bitcol, txfm_size_row);
  }

  col_txfm_16x16_rounding(&in[0], -shift[1]);
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_col; i++) {
    row_txfm((outcoef128 + i), (outcoef128 + i), bitrow, num_col);
  }
  (void)bd;
}